

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HModel.cpp
# Opt level: O3

void __thiscall
HModel::util_reportRowMtx
          (HModel *this,int nrow,vector<int,_std::allocator<int>_> *XARstart,
          vector<int,_std::allocator<int>_> *XARindex,
          vector<double,_std::allocator<double>_> *XARvalue)

{
  pointer piVar1;
  ulong uVar2;
  ulong uVar3;
  long lVar4;
  
  if (0 < nrow) {
    puts("Row    Index       Value");
    piVar1 = (XARstart->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
             super__Vector_impl_data._M_start;
    uVar2 = 0;
    do {
      printf("%6d Start %8d\n",uVar2 & 0xffffffff,(ulong)(uint)piVar1[uVar2]);
      piVar1 = (XARstart->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
               super__Vector_impl_data._M_start;
      lVar4 = (long)piVar1[uVar2];
      uVar3 = uVar2 + 1;
      if (piVar1[uVar2] < piVar1[uVar2 + 1]) {
        do {
          printf("      %6d %11g\n",
                 (XARvalue->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                 super__Vector_impl_data._M_start[lVar4],
                 (ulong)(uint)(XARindex->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                              super__Vector_impl_data._M_start[lVar4]);
          lVar4 = lVar4 + 1;
          piVar1 = (XARstart->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                   super__Vector_impl_data._M_start;
        } while (lVar4 < piVar1[uVar3]);
      }
      uVar2 = uVar3;
    } while (uVar3 != (uint)nrow);
    printf("       Start %8d\n",(ulong)(uint)piVar1[(uint)nrow]);
    return;
  }
  return;
}

Assistant:

void HModel::util_reportRowMtx(int nrow, vector<int>& XARstart, vector<int>& XARindex, vector<double>& XARvalue) {
  // Report the row-wise matrix passed to the method
  if (nrow <= 0) return;
  printf("Row    Index       Value\n");
  for (int row = 0; row < nrow; row++) {
    printf("%6d Start %8d\n", row, XARstart[row]);
    for (int el = XARstart[row]; el < XARstart[row+1]; el++) {
      printf("      %6d %11g\n", XARindex[el], XARvalue[el]);
    }
  }
    printf("       Start %8d\n", XARstart[nrow]);
}